

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::LegalizeAndPruneJSInterface::run
          (LegalizeAndPruneJSInterface *this,Module *module)

{
  pointer puVar1;
  Export *pEVar2;
  pointer puVar3;
  char *pcVar4;
  Function *pFVar5;
  Iterator __it;
  Iterator __it_00;
  bool bVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  Expression *pEVar9;
  difference_type dVar10;
  Type *pTVar11;
  Builder BVar12;
  variant<wasm::Name,_wasm::HeapType> *__k;
  Type type;
  long lVar13;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar14;
  pointer puVar15;
  Iterator __it_01;
  Iterator __it_02;
  Iterator __it_03;
  Iterator __it_04;
  Iterator __it_05;
  Iterator IVar16;
  SmallVector<wasm::Literal,_1UL> local_108;
  undefined1 local_d0 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  exportedFunctions;
  undefined1 local_80 [8];
  Signature sig;
  LegalizeAndPruneJSInterface *local_48;
  Type local_40;
  Builder builder;
  
  LegalizeJSInterface::run(&this->super_LegalizeJSInterface,module);
  local_d0 = (undefined1  [8])&exportedFunctions._M_h._M_rehash_policy._M_next_resize;
  exportedFunctions._M_h._M_buckets = (__buckets_ptr)0x1;
  exportedFunctions._M_h._M_bucket_count = 0;
  exportedFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exportedFunctions._M_h._M_element_count._0_4_ = 0x3f800000;
  exportedFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  exportedFunctions._M_h._M_rehash_policy._4_4_ = 0;
  exportedFunctions._M_h._M_rehash_policy._M_next_resize = 0;
  puVar1 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (module->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar1; puVar14 = puVar14 + 1
      ) {
    pEVar2 = (puVar14->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar2->kind == Function) {
      if (*(__index_type *)
           ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0')
      {
        __k = &pEVar2->value;
      }
      else {
        __k = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      pmVar7 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_d0,(key_type *)__k);
      pcVar4 = *(char **)((long)&(pEVar2->name).super_IString + 8);
      (pmVar7->super_IString).str._M_len = *(size_t *)&(pEVar2->name).super_IString;
      (pmVar7->super_IString).str._M_str = pcVar4;
    }
  }
  puVar15 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar15 == puVar3) {
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_d0);
      return;
    }
    type.id = (uintptr_t)
              (puVar15->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pcVar4 = *(char **)((long)&(((Function *)type.id)->super_Importable).module + 8);
    sVar8 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_d0,(key_type *)type.id);
    if (pcVar4 != (char *)0x0 || sVar8 != 0) {
      _local_80 = HeapType::getSignature
                            (&((puVar15->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->type);
      bVar6 = isIllegal((LegalizeAndPruneJSInterface *)local_80._8_8_.id,type);
      if (!bVar6) {
        IVar16 = wasm::Type::end((Type *)local_80);
        BVar12.wasm = (Module *)
                      IVar16.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index;
        local_40.id = (uintptr_t)local_80;
        builder.wasm = (Module *)0x0;
        exportedFunctions._M_h._M_single_bucket = (__node_base_ptr)BVar12.wasm;
        sig.results.id =
             (uintptr_t)
             IVar16.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
        local_48 = this;
        dVar10 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator-
                           ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                            &sig.results,(Iterator *)&stack0xffffffffffffffc0);
        for (lVar13 = dVar10 >> 2; 0 < lVar13; lVar13 = lVar13 + -1) {
          __it.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)builder.wasm;
          __it.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)local_40.id;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                  ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                *)&local_48,__it);
          if (bVar6) {
LAB_00a64dee:
            pTVar11 = &stack0xffffffffffffffc0;
            BVar12.wasm = builder.wasm;
            goto LAB_00a64df6;
          }
          __it_01.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (Module *)
               ((long)&((builder.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
          __it_01.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)local_40.id;
          builder.wasm = __it_01.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                         .index;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                  ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                *)&local_48,__it_01);
          if (bVar6) goto LAB_00a64dee;
          __it_02.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (Module *)
               ((long)&((builder.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
          __it_02.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)local_40.id;
          builder.wasm = __it_02.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                         .index;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                  ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                *)&local_48,__it_02);
          if (bVar6) goto LAB_00a64dee;
          __it_03.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (Module *)
               ((long)&((builder.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
          __it_03.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)local_40.id;
          builder.wasm = __it_03.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                         .index;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                  ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                *)&local_48,__it_03);
          if (bVar6) goto LAB_00a64dee;
          builder.wasm = (Module *)
                         ((long)&((builder.wasm)->exports).
                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
        }
        dVar10 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator-
                           ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                            &sig.results,(Iterator *)&stack0xffffffffffffffc0);
        if (dVar10 == 3) {
          __it_00.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               (size_t)builder.wasm;
          __it_00.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)local_40.id;
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                  ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                *)&local_48,__it_00);
          if (!bVar6) {
            builder.wasm = (Module *)
                           ((long)&((builder.wasm)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1);
            goto LAB_00a64ea1;
          }
LAB_00a64ed2:
          pTVar11 = &stack0xffffffffffffffc0;
          BVar12.wasm = builder.wasm;
        }
        else {
          if (dVar10 == 2) {
LAB_00a64ea1:
            __it_04.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)builder.wasm;
            __it_04.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)local_40.id;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                    ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                  *)&local_48,__it_04);
            if (!bVar6) {
              builder.wasm = (Module *)
                             ((long)&((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
              goto LAB_00a64ebd;
            }
            goto LAB_00a64ed2;
          }
          if (dVar10 == 1) {
LAB_00a64ebd:
            __it_05.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)builder.wasm;
            __it_05.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)local_40.id;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::{lambda(wasm::Type_const&)#1}>
                    ::operator()((_Iter_pred<wasm::(anonymous_namespace)::LegalizeAndPruneJSInterface::prune(wasm::Module*)::_lambda(wasm::Type_const&)_1_>
                                  *)&local_48,__it_05);
            if (bVar6) goto LAB_00a64ed2;
          }
          pTVar11 = &sig.results;
        }
LAB_00a64df6:
        if ((BVar12.wasm == (Module *)exportedFunctions._M_h._M_single_bucket) &&
           ((Type *)pTVar11->id ==
            IVar16.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent))
        goto LAB_00a64e45;
      }
      if (pcVar4 != (char *)0x0) {
        pFVar5 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        (pFVar5->super_Importable).base.super_IString.str._M_len = 0;
        *(char **)((long)&(pFVar5->super_Importable).base + 8) = (char *)0x0;
        pFVar5 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        (pFVar5->super_Importable).module.super_IString.str._M_len = 0;
        *(char **)((long)&(pFVar5->super_Importable).module + 8) = (char *)0x0;
        local_40.id = (uintptr_t)module;
        if (sig.params.id == 0) {
          pEVar9 = (Expression *)MixedArena::alloc<wasm::Nop>(&module->allocator);
          ((puVar15->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->body = pEVar9;
        }
        else {
          Literal::makeZeros((Literals *)&local_108,sig.params);
          pEVar9 = Builder::makeConstantExpression
                             ((Builder *)&stack0xffffffffffffffc0,(Literals *)&local_108);
          ((puVar15->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->body = pEVar9;
          SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_108);
        }
      }
      if (sVar8 != 0) {
        pmVar7 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_d0,
                              (key_type *)
                              (puVar15->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        Module::removeExport(module,(Name)(pmVar7->super_IString).str);
      }
    }
LAB_00a64e45:
    puVar15 = puVar15 + 1;
  } while( true );
}

Assistant:

void run(Module* module) override {
    LegalizeJSInterface::run(module);

    prune(module);
  }